

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O3

void __thiscall despot::Grid<int>::Grid(Grid<int> *this,int xsize,int ysize)

{
  this->xsize_ = xsize;
  this->ysize_ = ysize;
  (this->grid_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->grid_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->grid_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->grid_,(long)(ysize * xsize));
  return;
}

Assistant:

Grid(int xsize, int ysize) :
		xsize_(xsize),
		ysize_(ysize) {
		grid_.resize(xsize * ysize);
	}